

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  char cVar1;
  Expr *pEVar2;
  char *pcVar3;
  Token s;
  Token local_10;
  
  if (zC == (char *)0x0) {
    local_10.n = 0;
  }
  else {
    local_10.n = 0xffffffff;
    pcVar3 = zC;
    do {
      local_10.n = local_10.n + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    local_10.n = local_10.n & 0x3fffffff;
  }
  local_10.z = zC;
  pEVar2 = sqlite3ExprAddCollateToken(pParse,pExpr,&local_10);
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(Parse *pParse, Expr *pExpr, const char *zC){
  Token s;
  assert( zC!=0 );
  s.z = zC;
  s.n = sqlite3Strlen30(s.z);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s);
}